

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::ParenthesizedBinsSelectExprSyntax::setChild
          (ParenthesizedBinsSelectExprSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar7;
  
  if (index == 2) {
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar6->field_0x2;
    NVar3.raw = (pvVar6->numFlags).raw;
    uVar4 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->closeParen).kind = pvVar6->kind;
    (this->closeParen).field_0x2 = uVar2;
    (this->closeParen).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->closeParen).rawLen = uVar4;
    (this->closeParen).info = pIVar1;
  }
  else if (index == 1) {
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar7 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar7 = *ppSVar5;
    }
    (this->expr).ptr = (BinsSelectExpressionSyntax *)pSVar7;
  }
  else {
    pvVar6 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar6->field_0x2;
    NVar3.raw = (pvVar6->numFlags).raw;
    uVar4 = pvVar6->rawLen;
    pIVar1 = pvVar6->info;
    (this->openParen).kind = pvVar6->kind;
    (this->openParen).field_0x2 = uVar2;
    (this->openParen).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->openParen).rawLen = uVar4;
    (this->openParen).info = pIVar1;
  }
  return;
}

Assistant:

void ParenthesizedBinsSelectExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<BinsSelectExpressionSyntax>() : nullptr; return;
        case 2: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}